

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb_tree.c
# Opt level: O0

_Bool rotate_l(hb_tree *tree,hb_node *q)

{
  hb_node *phVar1;
  hb_node *phVar2;
  ulong uVar3;
  ulong uVar4;
  hb_tree *local_50;
  hb_tree *local_48;
  int qr_bal;
  hb_node *qrl;
  hb_node *qr;
  hb_node *qp;
  hb_node *q_local;
  hb_tree *tree_local;
  
  uVar4 = (q->field_2).bal & 0xfffffffffffffffc;
  phVar1 = q->rlink;
  if (((q->field_2).bal & 1U) != 0) {
    phVar2 = phVar1->llink;
    uVar3 = (phVar1->field_2).bal;
    (q->field_2).bal = (ulong)phVar1 | (long)(int)(uint)((uVar3 & 3) == 0);
    q->rlink = phVar2;
    if (phVar2 != (hb_node *)0x0) {
      (phVar2->field_2).bal = (ulong)q | (phVar2->field_2).bal & 3U;
    }
    (phVar1->field_2).bal = uVar4 | (long)(int)((uint)((uVar3 & 3) == 0) << 1);
    phVar1->llink = q;
    local_48 = tree;
    if (uVar4 != 0) {
      if (*(hb_node **)(uVar4 + 0x18) == q) {
        local_50 = (hb_tree *)(uVar4 + 0x18);
      }
      else {
        local_50 = (hb_tree *)(uVar4 + 0x20);
      }
      local_48 = local_50;
    }
    local_48->root = phVar1;
    return (uVar3 & 3) == 0;
  }
  fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/hb_tree.c"
          ,0xac,"rotate_l","BAL_POS(q)");
  abort();
}

Assistant:

static bool
rotate_l(hb_tree* restrict const tree, hb_node* restrict const q)
{
    hb_node* restrict const qp = PARENT(q);
    hb_node* restrict const qr = q->rlink;

    ASSERT(BAL_POS(q));

    hb_node *restrict const qrl = qr->llink;
    const int qr_bal = qr->bal & BAL_MASK;

    /* q->parent <- qr; q->bal <- (qr_bal == 0); */
    q->bal = (intptr_t)qr | (qr_bal == 0);
    if ((q->rlink = qrl) != NULL)
	qrl->bal = (intptr_t)q | (qrl->bal & BAL_MASK); /* qrl->parent <- q; */

    /* qr->parent <- qp; qr->bal <- -(qr_bal == 0); */
    qr->bal = (intptr_t)qp | ((qr_bal == 0) << 1);
    qr->llink = q;
    *(qp == NULL ? &tree->root : qp->llink == q ? &qp->llink : &qp->rlink) = qr;

    return (qr_bal == 0);
}